

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

void predict_or_learn<true>(baseline *data,single_learner *base,example *ec)

{
  uchar *puVar1;
  bool bVar2;
  float *pfVar3;
  example *in_RDX;
  undefined8 in_RSI;
  int __x;
  example *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  example *unaff_retaddr;
  float multiplier;
  float pred;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t uVar4;
  namespace_index c;
  
  if ((((in_RDI->super_example_predict).indices.erase_count & 0x10000) == 0) ||
     (bVar2 = BASELINE::baseline_enabled(in_RDI), bVar2)) {
    if (((in_RDI->super_example_predict).indices.erase_count & 1) == 0) {
      __x = (int)in_RSI;
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      c = (namespace_index)((ulong)in_RSI >> 0x38);
    }
    else {
      if (((in_RDI->super_example_predict).indices.erase_count & 0x100) == 0) {
        init_global((baseline *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        *(undefined1 *)((long)&(in_RDI->super_example_predict).indices.erase_count + 1) = 1;
      }
      VW::copy_example_metadata
                (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,
                 (example *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      (in_RDX->l).simple.initial =
           *(float *)((in_RDI->super_example_predict).indices._begin + 0x6850);
      __x = (int)in_RSI;
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      c = (namespace_index)((ulong)in_RSI >> 0x38);
    }
    uVar4 = (in_RDX->pred).multiclass;
    puVar1 = (in_RDI->super_example_predict).indices._begin;
    *(label_t *)(puVar1 + 0x6828) = (in_RDX->l).multi;
    *(float *)(puVar1 + 0x6830) = (in_RDX->l).simple.initial;
    if (((in_RDI->super_example_predict).indices.erase_count & 1) == 0) {
      VW::copy_example_metadata((bool)c,in_RDX,(example *)CONCAT44(uVar4,in_stack_ffffffffffffffe0))
      ;
      __x = (int)(in_RDI->super_example_predict).indices._begin;
      VW::move_feature_namespace(unaff_retaddr,in_RDI,c);
    }
    if (((ulong)(in_RDI->super_example_predict).indices.end_array & 1) == 0) {
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                 (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    else {
      in_stack_ffffffffffffffe0 =
           *(float *)((long)&(in_RDI->super_example_predict).indices.end_array + 4);
      if ((in_stack_ffffffffffffffe0 == 0.0) && (!NAN(in_stack_ffffffffffffffe0))) {
        in_stack_ffffffffffffffdc = 0.0001;
        std::abs(__x);
        in_stack_ffffffffffffffd8 = extraout_XMM0_Da;
        std::abs(__x);
        in_stack_ffffffffffffffd4 = extraout_XMM0_Da_00;
        pfVar3 = std::max<float>((float *)&stack0xffffffffffffffd8,(float *)&stack0xffffffffffffffd4
                                );
        pfVar3 = std::max<float>((float *)&stack0xffffffffffffffdc,pfVar3);
        in_stack_ffffffffffffffe0 = *pfVar3;
        if (1000.0 < in_stack_ffffffffffffffe0) {
          in_stack_ffffffffffffffe0 = 1000.0;
        }
      }
      puVar1 = (in_RDI->super_example_predict).indices._end;
      *(float *)(puVar1 + 0x3560) = in_stack_ffffffffffffffe0 * *(float *)(puVar1 + 0x3560);
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                 (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      puVar1 = (in_RDI->super_example_predict).indices._end;
      *(float *)(puVar1 + 0x3560) = *(float *)(puVar1 + 0x3560) / in_stack_ffffffffffffffe0;
    }
    (in_RDX->l).simple.initial = *(float *)((in_RDI->super_example_predict).indices._begin + 0x6850)
    ;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (((in_RDI->super_example_predict).indices.erase_count & 1) == 0) {
      VW::move_feature_namespace(unaff_retaddr,in_RDI,c);
    }
    (in_RDX->pred).multiclass = uVar4;
  }
  else {
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void predict_or_learn(baseline& data, single_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
    return;
  }

  // always do a full prediction, for safety in accurate predictive validation
  if (data.global_only)
  {
    if (!data.global_initialized)
    {
      init_global(data);
      data.global_initialized = true;
    }
    VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
    base.predict(*data.ec);
    ec.l.simple.initial = data.ec->pred.scalar;
    base.predict(ec);
  }
  else
    base.predict(ec);

  if (is_learn)
  {
    const float pred = ec.pred.scalar;  // save 'safe' prediction

    // now learn
    data.ec->l.simple = ec.l.simple;
    if (!data.global_only)
    {
      // move label & constant features data over to baseline example
      VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
      VW::move_feature_namespace(data.ec, &ec, constant_namespace);
    }

    // regress baseline on label
    if (data.lr_scaling)
    {
      float multiplier = data.lr_multiplier;
      if (multiplier == 0)
      {
        multiplier = max<float>(0.0001f, max<float>(abs(data.all->sd->min_label), abs(data.all->sd->max_label)));
        if (multiplier > max_multiplier)
          multiplier = max_multiplier;
      }
      data.all->eta *= multiplier;
      base.learn(*data.ec);
      data.all->eta /= multiplier;
    }
    else
      base.learn(*data.ec);

    // regress residual
    ec.l.simple.initial = data.ec->pred.scalar;
    base.learn(ec);

    if (!data.global_only)
    {
      // move feature data back to the original example
      VW::move_feature_namespace(&ec, data.ec, constant_namespace);
    }

    // return the safe prediction
    ec.pred.scalar = pred;
  }
}